

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O3

bool_t zzRandNZMod(word *a,word *mod,size_t n,gen_i rng,void *rng_state)

{
  bool_t bVar1;
  int iVar2;
  size_t pos;
  long lVar3;
  ulong count;
  bool bVar4;
  
  pos = wwBitSize(mod,n);
  lVar3 = (ulong)(pos < 0x11) * 0x40 + 0x40;
  count = pos + 7 >> 3;
  do {
    (*rng)(a,count,rng_state);
    u64From(a,a,count);
    wwTrimHi(a,n,pos);
    bVar1 = wwIsZero(a,n);
    if (bVar1 == 0) {
      iVar2 = wwCmp(a,mod,n);
      if (iVar2 < 0) goto LAB_00135610;
    }
    bVar4 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar4);
  lVar3 = -1;
LAB_00135610:
  return (uint)(lVar3 != -1);
}

Assistant:

bool_t zzRandNZMod(word a[], const word mod[], size_t n, gen_i rng, 
	void* rng_state)
{
	register size_t l;
	register size_t i;
	// pre
	ASSERT(wwIsDisjoint(a, mod, n));
	ASSERT(n > 0 && mod[n - 1] != 0 && wwCmpW(mod, n, 1) > 0);
	// генерировать
	l = wwBitSize(mod, n);
	i = (l <= 16) ? 2 * B_PER_IMPOSSIBLE : B_PER_IMPOSSIBLE;
	do
	{
		rng(a, O_OF_B(l), rng_state);
		wwFrom(a, a, O_OF_B(l));
		wwTrimHi(a, n, l);
	}
	while ((wwIsZero(a, n) || wwCmp(a, mod, n) >= 0) && i--);
	// выход
	l = 0;
	return i != SIZE_MAX;
}